

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v8::detail::bigint::assign(bigint *this,uint64_t n)

{
  size_t count;
  uint *puVar1;
  unsigned_long local_20;
  size_t num_bigits;
  uint64_t n_local;
  bigint *this_local;
  
  local_20 = 0;
  num_bigits = n;
  do {
    count = local_20 + 1;
    puVar1 = buffer<unsigned_int>::operator[]<unsigned_long>((buffer<unsigned_int> *)this,local_20);
    *puVar1 = (uint)num_bigits;
    num_bigits = num_bigits >> 0x20;
    local_20 = count;
  } while (num_bigits != 0);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::resize
            (&this->bigits_,count);
  this->exp_ = 0;
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign(uint64_t n) {
    size_t num_bigits = 0;
    do {
      bigits_[num_bigits++] = n & ~bigit(0);
      n >>= bigit_bits;
    } while (n != 0);
    bigits_.resize(num_bigits);
    exp_ = 0;
  }